

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O3

FT_Error FT_Bitmap_Done(FT_Library library,FT_Bitmap *bitmap)

{
  FT_Error FVar1;
  
  if (library != (FT_Library)0x0) {
    if (bitmap == (FT_Bitmap *)0x0) {
      FVar1 = 6;
    }
    else {
      ft_mem_free(library->memory,bitmap->buffer);
      bitmap->buffer = (uchar *)0x0;
      bitmap->num_grays = 0;
      bitmap->pixel_mode = '\0';
      bitmap->palette_mode = '\0';
      *(undefined4 *)&bitmap->field_0x1c = 0;
      bitmap->rows = 0;
      bitmap->width = 0;
      *(undefined8 *)&bitmap->pitch = 0;
      bitmap->palette = (void *)0x0;
      FVar1 = 0;
    }
    return FVar1;
  }
  return 0x21;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Done( FT_Library  library,
                  FT_Bitmap  *bitmap )
  {
    FT_Memory  memory;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !bitmap )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    FT_FREE( bitmap->buffer );
    *bitmap = null_bitmap;

    return FT_Err_Ok;
  }